

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moment_suite.cpp
# Opt level: O0

void kurtosis_double_suite::test_same(void)

{
  undefined8 local_188;
  value_type local_180 [2];
  undefined8 local_170;
  value_type local_168 [2];
  undefined8 local_158;
  value_type local_150 [2];
  undefined8 local_140;
  value_type local_138 [2];
  undefined8 local_128;
  value_type local_120 [2];
  undefined8 local_110;
  value_type local_108 [2];
  undefined8 local_f8;
  value_type local_f0 [2];
  undefined8 local_e0;
  value_type local_d8 [2];
  undefined8 local_c8;
  value_type local_c0 [2];
  undefined8 local_b0;
  value_type local_a8 [2];
  undefined8 local_98;
  value_type local_90 [2];
  undefined8 local_80;
  value_type local_78 [2];
  undefined1 local_68 [8];
  moment_kurtosis<double> filter;
  
  trial::online::decay::basic_moment<double,_(trial::online::with)4>::basic_moment
            ((basic_moment<double,_(trial::online::with)4> *)local_68,0.125,0.25,0.25,0.25);
  trial::online::decay::basic_moment<double,_(trial::online::with)4>::push
            ((basic_moment<double,_(trial::online::with)4> *)local_68,1.0);
  local_78[0] = trial::online::decay::basic_moment<double,_(trial::online::with)1>::mean
                          ((basic_moment<double,_(trial::online::with)1> *)local_68);
  local_80 = 0x3ff0000000000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","1.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0x294,"void kurtosis_double_suite::test_same()",local_78,&local_80);
  local_90[0] = trial::online::decay::basic_moment<double,_(trial::online::with)2>::variance
                          ((basic_moment<double,_(trial::online::with)2> *)local_68);
  local_98 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.variance()","0.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0x295,"void kurtosis_double_suite::test_same()",local_90,&local_98);
  local_a8[0] = trial::online::decay::basic_moment<double,_(trial::online::with)3>::skewness
                          ((basic_moment<double,_(trial::online::with)3> *)local_68);
  local_b0 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.skewness()","0.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0x296,"void kurtosis_double_suite::test_same()",local_a8,&local_b0);
  local_c0[0] = trial::online::decay::basic_moment<double,_(trial::online::with)4>::kurtosis
                          ((basic_moment<double,_(trial::online::with)4> *)local_68);
  local_c8 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.kurtosis()","0.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0x297,"void kurtosis_double_suite::test_same()",local_c0,&local_c8);
  trial::online::decay::basic_moment<double,_(trial::online::with)4>::push
            ((basic_moment<double,_(trial::online::with)4> *)local_68,1.0);
  local_d8[0] = trial::online::decay::basic_moment<double,_(trial::online::with)1>::mean
                          ((basic_moment<double,_(trial::online::with)1> *)local_68);
  local_e0 = 0x3ff0000000000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","1.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0x299,"void kurtosis_double_suite::test_same()",local_d8,&local_e0);
  local_f0[0] = trial::online::decay::basic_moment<double,_(trial::online::with)2>::variance
                          ((basic_moment<double,_(trial::online::with)2> *)local_68);
  local_f8 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.variance()","0.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0x29a,"void kurtosis_double_suite::test_same()",local_f0,&local_f8);
  local_108[0] = trial::online::decay::basic_moment<double,_(trial::online::with)3>::skewness
                           ((basic_moment<double,_(trial::online::with)3> *)local_68);
  local_110 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.skewness()","0.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0x29b,"void kurtosis_double_suite::test_same()",local_108,&local_110);
  local_120[0] = trial::online::decay::basic_moment<double,_(trial::online::with)4>::kurtosis
                           ((basic_moment<double,_(trial::online::with)4> *)local_68);
  local_128 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.kurtosis()","0.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0x29c,"void kurtosis_double_suite::test_same()",local_120,&local_128);
  trial::online::decay::basic_moment<double,_(trial::online::with)4>::push
            ((basic_moment<double,_(trial::online::with)4> *)local_68,1.0);
  local_138[0] = trial::online::decay::basic_moment<double,_(trial::online::with)1>::mean
                           ((basic_moment<double,_(trial::online::with)1> *)local_68);
  local_140 = 0x3ff0000000000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","1.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0x29e,"void kurtosis_double_suite::test_same()",local_138,&local_140);
  local_150[0] = trial::online::decay::basic_moment<double,_(trial::online::with)2>::variance
                           ((basic_moment<double,_(trial::online::with)2> *)local_68);
  local_158 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.variance()","0.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0x29f,"void kurtosis_double_suite::test_same()",local_150,&local_158);
  local_168[0] = trial::online::decay::basic_moment<double,_(trial::online::with)3>::skewness
                           ((basic_moment<double,_(trial::online::with)3> *)local_68);
  local_170 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.skewness()","0.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0x2a0,"void kurtosis_double_suite::test_same()",local_168,&local_170);
  local_180[0] = trial::online::decay::basic_moment<double,_(trial::online::with)4>::kurtosis
                           ((basic_moment<double,_(trial::online::with)4> *)local_68);
  local_188 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.kurtosis()","0.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0x2a1,"void kurtosis_double_suite::test_same()",local_180,&local_188);
  return;
}

Assistant:

void test_same()
{
    decay::moment_kurtosis<double> filter(one_over_eight, one_over_four, one_over_four, one_over_four);
    filter.push(1.0);
    TRIAL_TEST_EQ(filter.mean(), 1.0);
    TRIAL_TEST_EQ(filter.variance(), 0.0);
    TRIAL_TEST_EQ(filter.skewness(), 0.0);
    TRIAL_TEST_EQ(filter.kurtosis(), 0.0);
    filter.push(1.0);
    TRIAL_TEST_EQ(filter.mean(), 1.0);
    TRIAL_TEST_EQ(filter.variance(), 0.0);
    TRIAL_TEST_EQ(filter.skewness(), 0.0);
    TRIAL_TEST_EQ(filter.kurtosis(), 0.0);
    filter.push(1.0);
    TRIAL_TEST_EQ(filter.mean(), 1.0);
    TRIAL_TEST_EQ(filter.variance(), 0.0);
    TRIAL_TEST_EQ(filter.skewness(), 0.0);
    TRIAL_TEST_EQ(filter.kurtosis(), 0.0);
}